

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O0

void __thiscall CDT::save(CDT *this,string *filepath)

{
  byte bVar1;
  long local_218;
  ofstream file;
  string *filepath_local;
  CDT *this_local;
  
  std::ofstream::ofstream(&local_218,(string *)filepath,_S_out);
  bVar1 = std::ios::operator!((ios *)((long)&local_218 + *(long *)(local_218 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::ofstream::close();
    std::ofstream::~ofstream(&local_218);
    return;
  }
  std::operator<<((ostream *)&std::cout,"ERROR [saving model]: Couldn\'t open up the file!\n");
  exit(1);
}

Assistant:

void CDT::save(const std::string& filepath) const{
    std::ofstream file(filepath);

    if(!file){
        std::cout<<"ERROR [saving model]: Couldn't open up the file!\n";
        exit(1);
    }

    // TO DO

    file.close();
}